

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteGroup
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  CodedOutputStream *in_RDX;
  MessageLite *in_RSI;
  int in_EDI;
  uint32 value_00;
  CodedOutputStream *in_stack_ffffffffffffffc0;
  CodedOutputStream *output_00;
  
  output_00 = in_RDX;
  MakeTag(in_EDI,WIRETYPE_START_GROUP);
  value_00 = (uint32)((ulong)in_RDX >> 0x20);
  io::CodedOutputStream::WriteTag(in_stack_ffffffffffffffc0,value_00);
  MessageLite::SerializeWithCachedSizes(in_RSI,output_00);
  MakeTag(in_EDI,WIRETYPE_END_GROUP);
  io::CodedOutputStream::WriteTag(output_00,value_00);
  return;
}

Assistant:

void WireFormatLite::WriteGroup(int field_number, const MessageLite& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  value.SerializeWithCachedSizes(output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}